

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O1

bool __thiscall
density::
heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>_>
::consume_operation::start_consume_impl
          (consume_operation *this,PrivateType param_1,
          heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>_>
          *i_queue)

{
  ulong uVar1;
  ControlBlock *pCVar2;
  
  if (this->m_control != (ControlBlock *)0x0) {
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>_>
    ::cancel_consume_impl(this->m_queue,this->m_control);
  }
  this->m_queue = i_queue;
  pCVar2 = i_queue->m_head;
  do {
    if (pCVar2 == i_queue->m_tail) {
      pCVar2 = (ControlBlock *)0x0;
LAB_00a82417:
      this->m_control = pCVar2;
      return pCVar2 != (ControlBlock *)0x0;
    }
    uVar1 = pCVar2->m_next;
    if ((uVar1 & 3) == 0) {
      pCVar2->m_next = uVar1 | 1;
      goto LAB_00a82417;
    }
    pCVar2 = (ControlBlock *)(uVar1 & 0xfffffffffffffff8);
  } while( true );
}

Assistant:

bool start_consume_impl(PrivateType, heter_queue * i_queue)
            {
                if (m_control != nullptr)
                {
                    m_queue->cancel_consume_impl(m_control);
                }
                m_queue   = i_queue;
                m_control = i_queue->start_consume_impl();
                return m_control != nullptr;
            }